

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

void __thiscall
ktx::ValidationContext::validateKTXglFormat(ValidationContext *this,uint8_t *data,uint32_t size)

{
  bool bVar1;
  _khr_df_model_e *p_Var2;
  int in_EDX;
  void *in_RSI;
  long in_RDI;
  Value value;
  string local_90 [32];
  string local_70 [4];
  khr_df_model_e in_stack_ffffffffffffff94;
  undefined4 local_50;
  VkFormat in_stack_ffffffffffffffb4;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  uint *in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  IssueError *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  ktxSupercmpScheme scheme;
  
  *(undefined1 *)(in_RDI + 0x114) = 1;
  if (*(int *)(in_RDI + 0x44) != 0) {
    toString_abi_cxx11_(in_stack_ffffffffffffffb4);
    error<std::__cxx11::string>
              ((ValidationContext *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
               in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  }
  if (in_EDX == 0xc) {
    local_50 = 0;
    iVar3 = 0;
    memcpy(&local_50,in_RSI,0xc);
    scheme = (ktxSupercmpScheme)((ulong)in_RSI >> 0x20);
    if (iVar3 != 0) {
      bVar1 = isSupercompressionBlockCompressed(*(ktxSupercmpScheme *)(in_RDI + 100));
      if (bVar1) {
        toString_abi_cxx11_(scheme);
        error<unsigned_int&,unsigned_int&,std::__cxx11::string>
                  ((ValidationContext *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                   in_stack_ffffffffffffffe0,(uint *)in_stack_ffffffffffffffd8,
                   in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        std::__cxx11::string::~string(local_70);
      }
      else {
        bVar1 = std::optional::operator_cast_to_bool((optional<_khr_df_model_e> *)0x2ba36a);
        if (bVar1) {
          p_Var2 = std::optional<_khr_df_model_e>::operator*((optional<_khr_df_model_e> *)0x2ba384);
          bVar1 = isColorModelBlockCompressed(*p_Var2);
          if (bVar1) {
            std::optional<_khr_df_model_e>::operator*((optional<_khr_df_model_e> *)0x2ba3bf);
            toString_abi_cxx11_(in_stack_ffffffffffffff94);
            error<unsigned_int&,unsigned_int&,std::__cxx11::string>
                      ((ValidationContext *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                       in_stack_ffffffffffffffe0,(uint *)in_stack_ffffffffffffffd8,
                       in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
            std::__cxx11::string::~string(local_90);
          }
        }
      }
    }
  }
  else {
    error<unsigned_int&>
              ((ValidationContext *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
               in_stack_ffffffffffffffe0,(uint *)in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void ValidationContext::validateKTXglFormat(const uint8_t* data, uint32_t size) {
    foundKTXglFormat = true;

    if (header.vkFormat != VK_FORMAT_UNDEFINED)
        error(Metadata::KTXglFormatWithVkFormat, toString(VkFormat(header.vkFormat)));

    if (size != 12) {
        error(Metadata::KTXglFormatInvalidSize, size);
        return;
    }

    struct Value {
        uint32_t glInternalformat = 0;
        uint32_t glFormat = 0;
        uint32_t glType = 0;
    };

    Value value{};
    std::memcpy(&value, data, size);

    if (value.glFormat != 0 || value.glType != 0) {
        if (isSupercompressionBlockCompressed(ktxSupercmpScheme(header.supercompressionScheme)))
            error(Metadata::KTXglFormatInvalidValueForCompressed, value.glFormat, value.glType, toString(ktxSupercmpScheme(header.supercompressionScheme)));

        else if (parsedColorModel && isColorModelBlockCompressed(*parsedColorModel))
            error(Metadata::KTXglFormatInvalidValueForCompressed, value.glFormat, value.glType, toString(*parsedColorModel));
    }
}